

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall OpenMPDirective::generateDOT(OpenMPDirective *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OpenMPDirectiveKind OVar2;
  _Base_ptr p_Var3;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar4;
  OpenMPClause *pOVar5;
  _Alloc_hider _Var6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long *plVar10;
  size_t sVar11;
  undefined8 *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type *psVar14;
  ulong *puVar15;
  ulong uVar16;
  long *plVar17;
  SourceLocation *pSVar18;
  pointer ppOVar19;
  char *pcVar20;
  undefined8 uVar21;
  uint uVar22;
  OpenMPDirective *pOVar23;
  uint uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string __str_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  string expr_name_1;
  string tkind;
  string indent;
  string current_line;
  string expr_name;
  string list_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string directive_kind;
  string filename;
  string node_id;
  ofstream output;
  undefined1 auStack_4e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  ulong *local_4c0;
  long local_4b8;
  ulong local_4b0;
  undefined8 uStack_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  ulong *local_480;
  long local_478;
  ulong local_470;
  long lStack_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ulong *local_440;
  undefined8 local_438;
  ulong local_430;
  undefined8 uStack_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  long lStack_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  char *local_380;
  undefined8 local_378;
  char local_370;
  undefined7 uStack_36f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 *local_340;
  long local_338;
  undefined1 local_330;
  undefined7 uStack_32f;
  OpenMPDirective *local_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  allocator<char> local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  long *local_2b0;
  long local_2a8;
  long local_2a0 [2];
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  long *local_270 [2];
  long local_260 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0._M_string_length = 0;
  local_2f0.field_2._M_local_buf[0] = '\0';
  OVar2 = this->kind;
  switch(OVar2) {
  case OMPD_for_simd:
    pcVar20 = "for_simd ";
    goto LAB_00152d5b;
  case OMPD_do_simd:
    pcVar20 = "do_simd ";
    goto LAB_00152d5b;
  case OMPD_parallel_for_simd:
    pcVar20 = "parallel_for_simd ";
    goto LAB_00152d5b;
  default:
    toString_abi_cxx11_((string *)local_230,this);
    std::__cxx11::string::operator=((string *)&local_2f0,(string *)local_230);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
    goto LAB_00152d90;
  case OMPD_declare_simd:
    pcVar20 = "declare_simd ";
    goto LAB_00152d5b;
  case OMPD_distribute_simd:
    pcVar20 = "distribute_simd ";
    goto LAB_00152d5b;
  case OMPD_distribute_parallel_for:
    pcVar20 = "distribute_parallel_for ";
    goto LAB_00152d5b;
  case OMPD_distribute_parallel_do:
    pcVar20 = "distribute_parallel_do ";
    goto LAB_00152d5b;
  case OMPD_distribute_parallel_for_simd:
    pcVar20 = "distribute_parallel_for_simd ";
    goto LAB_00152d5b;
  case OMPD_distribute_parallel_do_simd:
    pcVar20 = "distribute_parallel_do_simd ";
    goto LAB_00152d5b;
  case OMPD_cancellation_point:
    pcVar20 = "cancellation_point ";
    goto LAB_00152d5b;
  case OMPD_declare_reduction:
    pcVar20 = "declare_reduction ";
    goto LAB_00152d5b;
  case OMPD_declare_mapper:
    pcVar20 = "declare_mapper ";
    goto LAB_00152d5b;
  case OMPD_parallel_for:
    pcVar20 = "parallel_for ";
    goto LAB_00152d5b;
  case OMPD_parallel_do:
    pcVar20 = "parallel_do ";
    goto LAB_00152d5b;
  case OMPD_parallel_loop:
    pcVar20 = "parallel_loop ";
    goto LAB_00152d5b;
  case OMPD_parallel_sections:
    pcVar20 = "parallel_sections ";
    goto LAB_00152d5b;
  case OMPD_parallel_workshare:
    break;
  case OMPD_parallel_master:
    break;
  case OMPD_master_taskloop:
    break;
  case OMPD_master_taskloop_simd:
    break;
  case OMPD_parallel_master_taskloop:
    break;
  case OMPD_parallel_master_taskloop_simd:
    break;
  case OMPD_taskloop_simd:
    pcVar20 = "taskloop_simd ";
    goto LAB_00152d5b;
  case OMPD_target_data:
    pcVar20 = "target_data ";
    goto LAB_00152d5b;
  case OMPD_target_enter_data:
    pcVar20 = "target_enter_data ";
    goto LAB_00152d5b;
  case OMPD_target_update:
    pcVar20 = "target_update ";
    goto LAB_00152d5b;
  case OMPD_target_exit_data:
    pcVar20 = "target_exit_data ";
    goto LAB_00152d5b;
  case OMPD_declare_target:
    pcVar20 = "declare_target ";
    goto LAB_00152d5b;
  case OMPD_end_declare_target:
    pcVar20 = "end_declare_target ";
LAB_00152d5b:
    std::__cxx11::string::operator=((string *)&local_2f0,pcVar20);
    goto LAB_00152d90;
  case OMPD_teams_distribute:
    break;
  case OMPD_teams_distribute_simd:
    break;
  case OMPD_teams_distribute_parallel_for:
    break;
  case OMPD_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_loop:
    break;
  case OMPD_target_parallel:
    break;
  case OMPD_target_parallel_for:
    break;
  case OMPD_target_parallel_for_simd:
    break;
  case OMPD_target_parallel_loop:
    break;
  case OMPD_target_simd:
    break;
  case OMPD_target_teams:
    break;
  case OMPD_target_teams_distribute:
    break;
  case OMPD_target_teams_distribute_simd:
    break;
  case OMPD_target_teams_loop:
    break;
  case OMPD_target_teams_distribute_parallel_for:
    break;
  case OMPD_target_teams_distribute_parallel_for_simd:
    break;
  case OMPD_teams_distribute_parallel_do:
    break;
  case OMPD_teams_distribute_parallel_do_simd:
    break;
  case OMPD_target_parallel_do:
    break;
  case OMPD_target_parallel_do_simd:
    break;
  case OMPD_target_teams_distribute_parallel_do:
    break;
  case OMPD_target_teams_distribute_parallel_do_simd:
  }
  std::__cxx11::string::append((char *)&local_2f0);
LAB_00152d90:
  local_380 = &local_370;
  local_378 = 0;
  local_370 = '\0';
  std::operator+(&local_2d0,"graph OpenMPIR_",&local_2f0);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar13) {
    local_220[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_220[0]._8_8_ = plVar10[3];
    local_230 = (undefined1  [8])local_220;
  }
  else {
    local_220[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar10;
  }
  local_228 = plVar10[1];
  *plVar10 = (long)paVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_380,(string *)local_230);
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::substr((ulong)&local_2b0,(ulong)&local_2f0);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x1a6231);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar13) {
    local_220[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_220[0]._8_8_ = plVar10[3];
    local_230 = (undefined1  [8])local_220;
  }
  else {
    local_220[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar10;
  }
  local_228 = plVar10[1];
  *plVar10 = (long)paVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(local_230);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_2d0.field_2._M_allocated_capacity = *psVar14;
    local_2d0.field_2._8_8_ = plVar10[3];
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar14;
    local_2d0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_2d0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_320 = this;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  std::ofstream::ofstream(local_230,local_2d0._M_dataplus._M_p,_S_out);
  pcVar20 = local_380;
  if (local_380 == (char *)0x0) {
    std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
  }
  else {
    sVar11 = strlen(local_380);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\t",1);
  _Var6._M_p = local_2f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
  }
  else {
    sVar11 = strlen(local_2f0._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,_Var6._M_p,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
  if ((int)OVar2 < 0x18) {
    if (OVar2 == OMPD_declare_simd) {
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x01');
      pOVar23 = local_320;
      local_340 = &local_330;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,*(long *)&local_320[1].super_SourceLocation,
                 (long)&(local_320[1].super_SourceLocation.parent_construct)->line +
                 *(long *)&local_320[1].super_SourceLocation);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"declare_simd","");
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3e0,local_360._M_dataplus._M_p,
                 local_360._M_dataplus._M_p + local_360._M_string_length);
      std::__cxx11::string::append((char *)&local_3e0);
      iVar8 = std::__cxx11::string::compare((char *)&local_340);
      if (iVar8 != 0) {
        std::operator+(&local_4a0,&local_3c0,&local_360);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
        puVar15 = puVar12 + 2;
        if ((ulong *)*puVar12 == puVar15) {
          local_4b0 = *puVar15;
          uStack_4a8 = puVar12[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0 = *puVar15;
          local_4c0 = (ulong *)*puVar12;
        }
        local_4b8 = puVar12[1];
        *puVar12 = puVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_4c0,(ulong)local_3e0._M_dataplus._M_p);
        paVar13 = &local_4e0.field_2;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_4e0.field_2._M_allocated_capacity = *psVar14;
          local_4e0.field_2._8_8_ = plVar10[3];
          local_4e0._M_dataplus._M_p = (pointer)paVar13;
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *psVar14;
          local_4e0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_4e0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
        puVar15 = puVar12 + 2;
        if ((ulong *)*puVar12 == puVar15) {
          local_430 = *puVar15;
          uStack_428 = puVar12[3];
          local_440 = &local_430;
        }
        else {
          local_430 = *puVar15;
          local_440 = (ulong *)*puVar12;
        }
        local_438 = puVar12[1];
        *puVar12 = puVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
        if (local_440 != &local_430) {
          operator_delete(local_440,local_430 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != paVar13) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,local_4b0 + 1);
        }
        paVar1 = &local_4a0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        pcVar20 = local_380;
        if (local_380 == (char *)0x0) {
          std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
        }
        else {
          sVar11 = strlen(local_380);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
        }
        local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_420,local_3c0._M_dataplus._M_p,
                   local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
        std::__cxx11::string::append((char *)&local_420);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_420,(ulong)local_3e0._M_dataplus._M_p);
        local_480 = &local_470;
        puVar15 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar15) {
          local_470 = *puVar15;
          lStack_468 = plVar10[3];
        }
        else {
          local_470 = *puVar15;
          local_480 = (ulong *)*plVar10;
        }
        local_478 = plVar10[1];
        *plVar10 = (long)puVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_460.field_2._M_allocated_capacity = *psVar14;
          local_460.field_2._8_8_ = plVar10[3];
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        }
        else {
          local_460.field_2._M_allocated_capacity = *psVar14;
          local_460._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_460._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_460,(ulong)local_3e0._M_dataplus._M_p);
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0.field_2._8_8_ = plVar10[3];
          local_4a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_4a0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
        puVar15 = puVar12 + 2;
        if ((ulong *)*puVar12 == puVar15) {
          local_4b0 = *puVar15;
          uStack_4a8 = puVar12[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0 = *puVar15;
          local_4c0 = (ulong *)*puVar12;
        }
        local_4b8 = puVar12[1];
        *puVar12 = puVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_340)
        ;
        puVar15 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_4e0.field_2._M_allocated_capacity = *puVar15;
          local_4e0.field_2._8_8_ = puVar12[3];
          local_4e0._M_dataplus._M_p = (pointer)paVar13;
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *puVar15;
          local_4e0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_4e0._M_string_length = puVar12[1];
        *puVar12 = puVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
        puVar15 = puVar12 + 2;
        if ((ulong *)*puVar12 == puVar15) {
          local_430 = *puVar15;
          uStack_428 = puVar12[3];
          local_440 = &local_430;
        }
        else {
          local_430 = *puVar15;
          local_440 = (ulong *)*puVar12;
        }
        local_438 = puVar12[1];
        *puVar12 = puVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
        if (local_440 != &local_430) {
          operator_delete(local_440,local_430 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != paVar13) {
          operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,local_4b0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        pOVar23 = local_320;
        if (local_480 != &local_470) {
          operator_delete(local_480,local_470 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
        }
        pcVar20 = local_380;
        if (local_380 == (char *)0x0) {
          std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
        }
        else {
          sVar11 = strlen(local_380);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
        }
      }
    }
    else {
      if (OVar2 != OMPD_allocate) {
LAB_0015334b:
        std::__cxx11::string::substr((ulong)&local_3c0,(ulong)&local_2f0);
        std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_3c0);
        pOVar23 = local_320;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p == &local_3c0.field_2) goto LAB_00156c9b;
        goto LAB_00156c8b;
      }
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x01');
      local_340 = &local_330;
      local_338 = 0;
      local_330 = 0;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_360._M_string_length = 0;
      local_360.field_2._M_local_buf[0] = '\0';
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"allocate","");
      paVar13 = &local_4e0.field_2;
      local_4e0._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,local_3e0._M_dataplus._M_p,
                 local_3e0._M_dataplus._M_p + local_3e0._M_string_length);
      std::__cxx11::string::append((char *)&local_4e0);
      pOVar23 = local_320;
      local_4c0 = &local_4b0;
      std::__cxx11::string::_M_construct((ulong)&local_4c0,'\x01');
      *(undefined1 *)local_4c0 = 0x30;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != paVar13) {
        uVar21 = local_4e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_4b8 + local_4e0._M_string_length) {
        uVar16 = 0xf;
        if (local_4c0 != &local_4b0) {
          uVar16 = local_4b0;
        }
        if (uVar16 < local_4b8 + local_4e0._M_string_length) goto LAB_001531db;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_4c0,0,(char *)0x0,(ulong)local_4e0._M_dataplus._M_p);
      }
      else {
LAB_001531db:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_4c0)
        ;
      }
      local_440 = &local_430;
      puVar15 = puVar12 + 2;
      if ((ulong *)*puVar12 == puVar15) {
        local_430 = *puVar15;
        uStack_428 = puVar12[3];
      }
      else {
        local_430 = *puVar15;
        local_440 = (ulong *)*puVar12;
      }
      local_438 = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)puVar15 = 0;
      std::__cxx11::string::operator=((string *)&local_340,(string *)&local_440);
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      if (local_4c0 != &local_4b0) {
        operator_delete(local_4c0,local_4b0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != paVar13) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_4a0,&local_3c0,&local_3e0);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
      puVar15 = puVar12 + 2;
      if ((ulong *)*puVar12 == puVar15) {
        local_4b0 = *puVar15;
        uStack_4a8 = puVar12[3];
        local_4c0 = &local_4b0;
      }
      else {
        local_4b0 = *puVar15;
        local_4c0 = (ulong *)*puVar12;
      }
      local_4b8 = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_340);
      puVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_4e0.field_2._M_allocated_capacity = *puVar15;
        local_4e0.field_2._8_8_ = puVar12[3];
        local_4e0._M_dataplus._M_p = (pointer)paVar13;
      }
      else {
        local_4e0.field_2._M_allocated_capacity = *puVar15;
        local_4e0._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_4e0._M_string_length = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
      puVar15 = puVar12 + 2;
      if ((ulong *)*puVar12 == puVar15) {
        local_430 = *puVar15;
        uStack_428 = puVar12[3];
        local_440 = &local_430;
      }
      else {
        local_430 = *puVar15;
        local_440 = (ulong *)*puVar12;
      }
      local_438 = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != paVar13) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      if (local_4c0 != &local_4b0) {
        operator_delete(local_4c0,local_4b0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      pcVar20 = local_380;
      if (local_380 == (char *)0x0) {
        std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
      }
      else {
        sVar11 = strlen(local_380);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
      }
      pSVar18 = *(SourceLocation **)&pOVar23[1].super_SourceLocation;
      if (pSVar18 != pOVar23[1].super_SourceLocation.parent_construct) {
        uVar24 = 0;
        do {
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,local_340,local_340 + local_338);
          std::__cxx11::string::append((char *)&local_4e0);
          uVar22 = 1;
          if (9 < uVar24) {
            uVar16 = (ulong)uVar24;
            uVar7 = 4;
            do {
              uVar22 = uVar7;
              uVar9 = (uint)uVar16;
              if (uVar9 < 100) {
                uVar22 = uVar22 - 2;
                goto LAB_00153f67;
              }
              if (uVar9 < 1000) {
                uVar22 = uVar22 - 1;
                goto LAB_00153f67;
              }
              if (uVar9 < 10000) goto LAB_00153f67;
              uVar16 = uVar16 / 10000;
              uVar7 = uVar22 + 4;
            } while (99999 < uVar9);
            uVar22 = uVar22 + 1;
          }
LAB_00153f67:
          local_4c0 = &local_4b0;
          std::__cxx11::string::_M_construct((ulong)&local_4c0,(char)uVar22);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4c0,uVar22,uVar24);
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            uVar21 = local_4e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_4b8 + local_4e0._M_string_length) {
            uVar16 = 0xf;
            if (local_4c0 != &local_4b0) {
              uVar16 = local_4b0;
            }
            if (uVar16 < local_4b8 + local_4e0._M_string_length) goto LAB_00153fd8;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_4c0,0,(char *)0x0,(ulong)local_4e0._M_dataplus._M_p);
          }
          else {
LAB_00153fd8:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_4c0);
          }
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_430 = *puVar15;
            uStack_428 = puVar12[3];
            local_440 = &local_430;
          }
          else {
            local_430 = *puVar15;
            local_440 = (ulong *)*puVar12;
          }
          local_438 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)puVar15 = 0;
          std::__cxx11::string::operator=((string *)&local_360,(string *)&local_440);
          if (local_440 != &local_430) {
            operator_delete(local_440,local_430 + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_460,&local_3c0,&local_3c0);
          plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_340);
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0.field_2._8_8_ = plVar10[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_4a0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_4b0 = *puVar15;
            uStack_4a8 = puVar12[3];
            local_4c0 = &local_4b0;
          }
          else {
            local_4b0 = *puVar15;
            local_4c0 = (ulong *)*puVar12;
          }
          local_4b8 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_4c0,(ulong)local_360._M_dataplus._M_p);
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_4e0.field_2._M_allocated_capacity = *psVar14;
            local_4e0.field_2._8_8_ = plVar10[3];
          }
          else {
            local_4e0.field_2._M_allocated_capacity = *psVar14;
            local_4e0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_4e0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_430 = *puVar15;
            uStack_428 = puVar12[3];
            local_440 = &local_430;
          }
          else {
            local_430 = *puVar15;
            local_440 = (ulong *)*puVar12;
          }
          local_438 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
          if (local_440 != &local_430) {
            operator_delete(local_440,local_430 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          pcVar20 = local_380;
          if (local_380 == (char *)0x0) {
            std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8
                           );
          }
          else {
            sVar11 = strlen(local_380);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
          }
          std::operator+(&local_3a0,&local_3c0,&local_3c0);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_420.field_2._M_allocated_capacity = *psVar14;
            local_420.field_2._8_8_ = plVar10[3];
          }
          else {
            local_420.field_2._M_allocated_capacity = *psVar14;
            local_420._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_420._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_420,(ulong)local_360._M_dataplus._M_p);
          local_480 = &local_470;
          puVar15 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar15) {
            local_470 = *puVar15;
            lStack_468 = plVar10[3];
          }
          else {
            local_470 = *puVar15;
            local_480 = (ulong *)*plVar10;
          }
          local_478 = plVar10[1];
          *plVar10 = (long)puVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_460.field_2._M_allocated_capacity = *psVar14;
            local_460.field_2._8_8_ = plVar10[3];
          }
          else {
            local_460.field_2._M_allocated_capacity = *psVar14;
            local_460._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_460._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_460,(ulong)local_360._M_dataplus._M_p);
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0.field_2._8_8_ = plVar10[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_4a0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_4b0 = *puVar15;
            uStack_4a8 = puVar12[3];
            local_4c0 = &local_4b0;
          }
          else {
            local_4b0 = *puVar15;
            local_4c0 = (ulong *)*puVar12;
          }
          local_4b8 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,*(char **)pSVar18,(allocator<char> *)&local_318);
          uVar16 = 0xf;
          if (local_4c0 != &local_4b0) {
            uVar16 = local_4b0;
          }
          if (uVar16 < (ulong)(local_3f8 + local_4b8)) {
            uVar16 = 0xf;
            if (local_400 != &local_3f0) {
              uVar16 = local_3f0;
            }
            if (uVar16 < (ulong)(local_3f8 + local_4b8)) goto LAB_00154587;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_400,0,(char *)0x0,(ulong)local_4c0);
          }
          else {
LAB_00154587:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_400);
          }
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          puVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4e0.field_2._M_allocated_capacity = *puVar15;
            local_4e0.field_2._8_8_ = puVar12[3];
          }
          else {
            local_4e0.field_2._M_allocated_capacity = *puVar15;
            local_4e0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_4e0._M_string_length = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_430 = *puVar15;
            uStack_428 = puVar12[3];
            local_440 = &local_430;
          }
          else {
            local_430 = *puVar15;
            local_440 = (ulong *)*puVar12;
          }
          local_438 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
          if (local_440 != &local_430) {
            operator_delete(local_440,local_430 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          if (local_400 != &local_3f0) {
            operator_delete(local_400,local_3f0 + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          if (local_480 != &local_470) {
            operator_delete(local_480,local_470 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          pcVar20 = local_380;
          if (local_380 == (char *)0x0) {
            std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8
                           );
          }
          else {
            sVar11 = strlen(local_380);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
          }
          uVar24 = uVar24 + 1;
          pSVar18 = (SourceLocation *)&pSVar18->parent_construct;
          pOVar23 = local_320;
        } while (pSVar18 != local_320[1].super_SourceLocation.parent_construct);
      }
    }
LAB_00156c07:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,
                      CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                               local_3e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                               local_360.field_2._M_local_buf[0]) + 1);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p == &local_3c0.field_2) goto LAB_00156c9b;
  }
  else {
    if (OVar2 == OMPD_threadprivate) {
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x01');
      local_340 = &local_330;
      local_338 = 0;
      local_330 = 0;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_360._M_string_length = 0;
      local_360.field_2._M_local_buf[0] = '\0';
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"threadprivate","");
      pOVar23 = local_320;
      paVar13 = &local_4e0.field_2;
      local_4e0._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,local_3e0._M_dataplus._M_p,
                 local_3e0._M_dataplus._M_p + local_3e0._M_string_length);
      std::__cxx11::string::append((char *)&local_4e0);
      local_4c0 = &local_4b0;
      std::__cxx11::string::_M_construct((ulong)&local_4c0,'\x01');
      *(undefined1 *)local_4c0 = 0x30;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != paVar13) {
        uVar21 = local_4e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_4b8 + local_4e0._M_string_length) {
        uVar16 = 0xf;
        if (local_4c0 != &local_4b0) {
          uVar16 = local_4b0;
        }
        if (uVar16 < local_4b8 + local_4e0._M_string_length) goto LAB_001535e6;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_4c0,0,(char *)0x0,(ulong)local_4e0._M_dataplus._M_p);
      }
      else {
LAB_001535e6:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_4c0)
        ;
      }
      local_440 = &local_430;
      puVar15 = puVar12 + 2;
      if ((ulong *)*puVar12 == puVar15) {
        local_430 = *puVar15;
        uStack_428 = puVar12[3];
      }
      else {
        local_430 = *puVar15;
        local_440 = (ulong *)*puVar12;
      }
      local_438 = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)puVar15 = 0;
      std::__cxx11::string::operator=((string *)&local_340,(string *)&local_440);
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      if (local_4c0 != &local_4b0) {
        operator_delete(local_4c0,local_4b0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != paVar13) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_4a0,&local_3c0,&local_3e0);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
      puVar15 = puVar12 + 2;
      if ((ulong *)*puVar12 == puVar15) {
        local_4b0 = *puVar15;
        uStack_4a8 = puVar12[3];
        local_4c0 = &local_4b0;
      }
      else {
        local_4b0 = *puVar15;
        local_4c0 = (ulong *)*puVar12;
      }
      local_4b8 = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_340);
      puVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_4e0.field_2._M_allocated_capacity = *puVar15;
        local_4e0.field_2._8_8_ = puVar12[3];
        local_4e0._M_dataplus._M_p = (pointer)paVar13;
      }
      else {
        local_4e0.field_2._M_allocated_capacity = *puVar15;
        local_4e0._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_4e0._M_string_length = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
      puVar15 = puVar12 + 2;
      if ((ulong *)*puVar12 == puVar15) {
        local_430 = *puVar15;
        uStack_428 = puVar12[3];
        local_440 = &local_430;
      }
      else {
        local_430 = *puVar15;
        local_440 = (ulong *)*puVar12;
      }
      local_438 = puVar12[1];
      *puVar12 = puVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != paVar13) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      if (local_4c0 != &local_4b0) {
        operator_delete(local_4c0,local_4b0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      pcVar20 = local_380;
      if (local_380 == (char *)0x0) {
        std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
      }
      else {
        sVar11 = strlen(local_380);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
      }
      pSVar18 = *(SourceLocation **)&pOVar23[1].super_SourceLocation;
      if (pSVar18 != pOVar23[1].super_SourceLocation.parent_construct) {
        uVar24 = 0;
        do {
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,local_340,local_340 + local_338);
          std::__cxx11::string::append((char *)&local_4e0);
          uVar22 = 1;
          if (9 < uVar24) {
            uVar16 = (ulong)uVar24;
            uVar7 = 4;
            do {
              uVar22 = uVar7;
              uVar9 = (uint)uVar16;
              if (uVar9 < 100) {
                uVar22 = uVar22 - 2;
                goto LAB_00154b2d;
              }
              if (uVar9 < 1000) {
                uVar22 = uVar22 - 1;
                goto LAB_00154b2d;
              }
              if (uVar9 < 10000) goto LAB_00154b2d;
              uVar16 = uVar16 / 10000;
              uVar7 = uVar22 + 4;
            } while (99999 < uVar9);
            uVar22 = uVar22 + 1;
          }
LAB_00154b2d:
          local_4c0 = &local_4b0;
          std::__cxx11::string::_M_construct((ulong)&local_4c0,(char)uVar22);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4c0,uVar22,uVar24);
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            uVar21 = local_4e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_4b8 + local_4e0._M_string_length) {
            uVar16 = 0xf;
            if (local_4c0 != &local_4b0) {
              uVar16 = local_4b0;
            }
            if (uVar16 < local_4b8 + local_4e0._M_string_length) goto LAB_00154b9e;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_4c0,0,(char *)0x0,(ulong)local_4e0._M_dataplus._M_p);
          }
          else {
LAB_00154b9e:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_4c0);
          }
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_430 = *puVar15;
            uStack_428 = puVar12[3];
            local_440 = &local_430;
          }
          else {
            local_430 = *puVar15;
            local_440 = (ulong *)*puVar12;
          }
          local_438 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)puVar15 = 0;
          std::__cxx11::string::operator=((string *)&local_360,(string *)&local_440);
          if (local_440 != &local_430) {
            operator_delete(local_440,local_430 + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_460,&local_3c0,&local_3c0);
          plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_340);
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0.field_2._8_8_ = plVar10[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_4a0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_4b0 = *puVar15;
            uStack_4a8 = puVar12[3];
            local_4c0 = &local_4b0;
          }
          else {
            local_4b0 = *puVar15;
            local_4c0 = (ulong *)*puVar12;
          }
          local_4b8 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_4c0,(ulong)local_360._M_dataplus._M_p);
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_4e0.field_2._M_allocated_capacity = *psVar14;
            local_4e0.field_2._8_8_ = plVar10[3];
          }
          else {
            local_4e0.field_2._M_allocated_capacity = *psVar14;
            local_4e0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_4e0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_430 = *puVar15;
            uStack_428 = puVar12[3];
            local_440 = &local_430;
          }
          else {
            local_430 = *puVar15;
            local_440 = (ulong *)*puVar12;
          }
          local_438 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
          if (local_440 != &local_430) {
            operator_delete(local_440,local_430 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          pcVar20 = local_380;
          if (local_380 == (char *)0x0) {
            std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8
                           );
          }
          else {
            sVar11 = strlen(local_380);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
          }
          std::operator+(&local_3a0,&local_3c0,&local_3c0);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_420.field_2._M_allocated_capacity = *psVar14;
            local_420.field_2._8_8_ = plVar10[3];
          }
          else {
            local_420.field_2._M_allocated_capacity = *psVar14;
            local_420._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_420._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_420,(ulong)local_360._M_dataplus._M_p);
          local_480 = &local_470;
          puVar15 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar15) {
            local_470 = *puVar15;
            lStack_468 = plVar10[3];
          }
          else {
            local_470 = *puVar15;
            local_480 = (ulong *)*plVar10;
          }
          local_478 = plVar10[1];
          *plVar10 = (long)puVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_480);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_460.field_2._M_allocated_capacity = *psVar14;
            local_460.field_2._8_8_ = plVar10[3];
          }
          else {
            local_460.field_2._M_allocated_capacity = *psVar14;
            local_460._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_460._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_460,(ulong)local_360._M_dataplus._M_p);
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0.field_2._8_8_ = plVar10[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar14;
            local_4a0._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_4a0._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_4b0 = *puVar15;
            uStack_4a8 = puVar12[3];
            local_4c0 = &local_4b0;
          }
          else {
            local_4b0 = *puVar15;
            local_4c0 = (ulong *)*puVar12;
          }
          local_4b8 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,*(char **)pSVar18,(allocator<char> *)&local_318);
          uVar16 = 0xf;
          if (local_4c0 != &local_4b0) {
            uVar16 = local_4b0;
          }
          if (uVar16 < (ulong)(local_3f8 + local_4b8)) {
            uVar16 = 0xf;
            if (local_400 != &local_3f0) {
              uVar16 = local_3f0;
            }
            if (uVar16 < (ulong)(local_3f8 + local_4b8)) goto LAB_0015514d;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_400,0,(char *)0x0,(ulong)local_4c0);
          }
          else {
LAB_0015514d:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_400);
          }
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          puVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4e0.field_2._M_allocated_capacity = *puVar15;
            local_4e0.field_2._8_8_ = puVar12[3];
          }
          else {
            local_4e0.field_2._M_allocated_capacity = *puVar15;
            local_4e0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_4e0._M_string_length = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          puVar15 = puVar12 + 2;
          if ((ulong *)*puVar12 == puVar15) {
            local_430 = *puVar15;
            uStack_428 = puVar12[3];
            local_440 = &local_430;
          }
          else {
            local_430 = *puVar15;
            local_440 = (ulong *)*puVar12;
          }
          local_438 = puVar12[1];
          *puVar12 = puVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_380,(string *)&local_440);
          if (local_440 != &local_430) {
            operator_delete(local_440,local_430 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          if (local_400 != &local_3f0) {
            operator_delete(local_400,local_3f0 + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          if (local_480 != &local_470) {
            operator_delete(local_480,local_470 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          pcVar20 = local_380;
          if (local_380 == (char *)0x0) {
            std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8
                           );
          }
          else {
            sVar11 = strlen(local_380);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
          }
          uVar24 = uVar24 + 1;
          pSVar18 = (SourceLocation *)&pSVar18->parent_construct;
          pOVar23 = local_320;
        } while (pSVar18 != local_320[1].super_SourceLocation.parent_construct);
      }
      goto LAB_00156c07;
    }
    if (OVar2 != OMPD_declare_reduction) goto LAB_0015334b;
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x01');
    pOVar23 = local_320;
    local_340 = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,local_320[1].clauses_in_original_order,
               (long)&((local_320[1].clauses_in_original_order)->
                      super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + *(long *)&local_320[1].clauses._M_t._M_impl
              );
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    p_Var3 = pOVar23[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,p_Var3,
               (long)&(pOVar23[1].clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->
                      _M_color + (long)p_Var3);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    local_3e0._M_string_length = 0;
    local_3e0.field_2._M_local_buf[0] = '\0';
    local_440 = &local_430;
    local_438 = 0;
    local_430 = local_430 & 0xffffffffffffff00;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"declare_reduction","");
    local_4c0 = &local_4b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c0,local_4e0._M_dataplus._M_p,
               local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
    std::__cxx11::string::append((char *)&local_4c0);
    std::operator+(&local_420,&local_3c0,&local_4e0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
    local_480 = &local_470;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_470 = *puVar15;
      lStack_468 = plVar10[3];
    }
    else {
      local_470 = *puVar15;
      local_480 = (ulong *)*plVar10;
    }
    local_478 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_4c0);
    paVar13 = &local_460.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_460.field_2._M_allocated_capacity = *psVar14;
      local_460.field_2._8_8_ = plVar10[3];
      local_460._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_460.field_2._M_allocated_capacity = *psVar14;
      local_460._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_460._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    paVar1 = &local_4a0.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0.field_2._8_8_ = plVar10[3];
      local_4a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_4a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_380,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar13) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480,local_470 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    pcVar20 = local_380;
    if (local_380 == (char *)0x0) {
      std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
    }
    else {
      sVar11 = strlen(local_380);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
    }
    local_318 = &local_308;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,local_3c0._M_dataplus._M_p,
               local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
    std::__cxx11::string::append((char *)&local_318);
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_4c0);
    local_400 = &local_3f0;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_3f0 = *puVar15;
      lStack_3e8 = plVar10[3];
    }
    else {
      local_3f0 = *puVar15;
      local_400 = (ulong *)*plVar10;
    }
    local_3f8 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_400);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_3a0.field_2._M_allocated_capacity = *psVar14;
      local_3a0.field_2._8_8_ = plVar10[3];
    }
    else {
      local_3a0.field_2._M_allocated_capacity = *psVar14;
      local_3a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_4c0);
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_420.field_2._M_allocated_capacity = *psVar14;
      local_420.field_2._8_8_ = plVar10[3];
    }
    else {
      local_420.field_2._M_allocated_capacity = *psVar14;
      local_420._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_420._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
    local_480 = &local_470;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_470 = *puVar15;
      lStack_468 = plVar10[3];
    }
    else {
      local_470 = *puVar15;
      local_480 = (ulong *)*plVar10;
    }
    local_478 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_340);
    puVar15 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_460.field_2._M_allocated_capacity = *puVar15;
      local_460.field_2._8_8_ = plVar10[3];
      local_460._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_460.field_2._M_allocated_capacity = *puVar15;
      local_460._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_460._M_string_length = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0.field_2._8_8_ = plVar10[3];
      local_4a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_4a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_380,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar13) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480,local_470 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (local_400 != &local_3f0) {
      operator_delete(local_400,local_3f0 + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    pcVar20 = local_380;
    if (local_380 == (char *)0x0) {
      std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
    }
    else {
      sVar11 = strlen(local_380);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
    }
    local_460._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,local_4e0._M_dataplus._M_p,
               local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
    std::__cxx11::string::append((char *)&local_460);
    local_480 = &local_470;
    std::__cxx11::string::_M_construct((ulong)&local_480,'\x01');
    *(undefined1 *)local_480 = 0x30;
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar13) {
      uVar21 = local_460.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_478 + local_460._M_string_length) {
      uVar16 = 0xf;
      if (local_480 != &local_470) {
        uVar16 = local_470;
      }
      if (uVar16 < local_478 + local_460._M_string_length) goto LAB_00153c09;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_480,0,(char *)0x0,(ulong)local_460._M_dataplus._M_p);
    }
    else {
LAB_00153c09:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_480);
    }
    psVar14 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0.field_2._8_8_ = puVar12[3];
      local_4a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_4a0._M_string_length = puVar12[1];
    *puVar12 = psVar14;
    puVar12[1] = 0;
    *(undefined1 *)psVar14 = 0;
    std::__cxx11::string::operator=((string *)&local_3e0,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480,local_470 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar13) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_420,&local_3c0,&local_4e0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
    local_480 = &local_470;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_470 = *puVar15;
      lStack_468 = plVar10[3];
    }
    else {
      local_470 = *puVar15;
      local_480 = (ulong *)*plVar10;
    }
    local_478 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_3e0._M_dataplus._M_p);
    puVar15 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_460.field_2._M_allocated_capacity = *puVar15;
      local_460.field_2._8_8_ = puVar12[3];
      local_460._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_460.field_2._M_allocated_capacity = *puVar15;
      local_460._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_460._M_string_length = puVar12[1];
    *puVar12 = puVar15;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0.field_2._8_8_ = plVar10[3];
      local_4a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_4a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_380,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar13) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480,local_470 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    pcVar20 = local_380;
    if (local_380 == (char *)0x0) {
      std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
    }
    else {
      sVar11 = strlen(local_380);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
    }
    pSVar18 = *(SourceLocation **)&pOVar23[1].super_SourceLocation;
    if (pSVar18 != pOVar23[1].super_SourceLocation.parent_construct) {
      uVar24 = 0;
      do {
        local_460._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_460,local_3e0._M_dataplus._M_p,
                   local_3e0._M_dataplus._M_p + local_3e0._M_string_length);
        std::__cxx11::string::append((char *)&local_460);
        uVar22 = 1;
        if (9 < uVar24) {
          uVar16 = (ulong)uVar24;
          uVar7 = 4;
          do {
            uVar22 = uVar7;
            uVar9 = (uint)uVar16;
            if (uVar9 < 100) {
              uVar22 = uVar22 - 2;
              goto LAB_00155702;
            }
            if (uVar9 < 1000) {
              uVar22 = uVar22 - 1;
              goto LAB_00155702;
            }
            if (uVar9 < 10000) goto LAB_00155702;
            uVar16 = uVar16 / 10000;
            uVar7 = uVar22 + 4;
          } while (99999 < uVar9);
          uVar22 = uVar22 + 1;
        }
LAB_00155702:
        local_480 = &local_470;
        std::__cxx11::string::_M_construct((ulong)&local_480,(char)uVar22);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_480,uVar22,uVar24);
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != paVar13) {
          uVar21 = local_460.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_478 + local_460._M_string_length) {
          uVar16 = 0xf;
          if (local_480 != &local_470) {
            uVar16 = local_470;
          }
          if (uVar16 < local_478 + local_460._M_string_length) goto LAB_0015577c;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_480,0,(char *)0x0,(ulong)local_460._M_dataplus._M_p);
        }
        else {
LAB_0015577c:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_480);
        }
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        psVar14 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0.field_2._8_8_ = puVar12[3];
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_4a0._M_string_length = puVar12[1];
        *puVar12 = psVar14;
        puVar12[1] = 0;
        *(undefined1 *)psVar14 = 0;
        std::__cxx11::string::operator=((string *)&local_440,(string *)&local_4a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480,local_470 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != paVar13) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_3a0,&local_3c0,&local_3c0);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_3a0,(ulong)local_3e0._M_dataplus._M_p);
        local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_420.field_2._M_allocated_capacity = *psVar14;
          local_420.field_2._8_8_ = plVar10[3];
        }
        else {
          local_420.field_2._M_allocated_capacity = *psVar14;
          local_420._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_420._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
        puVar15 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar15) {
          local_470 = *puVar15;
          lStack_468 = plVar10[3];
          local_480 = &local_470;
        }
        else {
          local_470 = *puVar15;
          local_480 = (ulong *)*plVar10;
        }
        local_478 = plVar10[1];
        *plVar10 = (long)puVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_440);
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_460.field_2._M_allocated_capacity = *psVar14;
          local_460.field_2._8_8_ = plVar10[3];
          local_460._M_dataplus._M_p = (pointer)paVar13;
        }
        else {
          local_460.field_2._M_allocated_capacity = *psVar14;
          local_460._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_460._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0.field_2._8_8_ = plVar10[3];
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_4a0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_380,(string *)&local_4a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != paVar13) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480,local_470 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        pcVar20 = local_380;
        if (local_380 == (char *)0x0) {
          std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
        }
        else {
          sVar11 = strlen(local_380);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
        }
        std::operator+(&local_250,&local_3c0,&local_3c0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_250);
        plVar17 = plVar10 + 2;
        if ((long *)*plVar10 == plVar17) {
          local_308 = *plVar17;
          lStack_300 = plVar10[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *plVar17;
          local_318 = (long *)*plVar10;
        }
        local_310 = plVar10[1];
        *plVar10 = (long)plVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_440);
        local_400 = &local_3f0;
        puVar15 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar15) {
          local_3f0 = *puVar15;
          lStack_3e8 = plVar10[3];
        }
        else {
          local_3f0 = *puVar15;
          local_400 = (ulong *)*plVar10;
        }
        local_3f8 = plVar10[1];
        *plVar10 = (long)puVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_400);
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_3a0.field_2._M_allocated_capacity = *psVar14;
          local_3a0.field_2._8_8_ = plVar10[3];
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *psVar14;
          local_3a0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_3a0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_440);
        local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_420.field_2._M_allocated_capacity = *psVar14;
          local_420.field_2._8_8_ = plVar10[3];
        }
        else {
          local_420.field_2._M_allocated_capacity = *psVar14;
          local_420._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_420._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
        local_480 = &local_470;
        puVar15 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar15) {
          local_470 = *puVar15;
          lStack_468 = plVar10[3];
        }
        else {
          local_470 = *puVar15;
          local_480 = (ulong *)*plVar10;
        }
        local_478 = plVar10[1];
        *plVar10 = (long)puVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,*(char **)pSVar18,&local_2f1);
        uVar16 = 0xf;
        if (local_480 != &local_470) {
          uVar16 = local_470;
        }
        if (uVar16 < (ulong)(local_288 + local_478)) {
          uVar16 = 0xf;
          if (local_290 != local_280) {
            uVar16 = local_280[0];
          }
          if (uVar16 < (ulong)(local_288 + local_478)) goto LAB_00155d67;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_480);
        }
        else {
LAB_00155d67:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_290);
        }
        puVar15 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_460.field_2._M_allocated_capacity = *puVar15;
          local_460.field_2._8_8_ = puVar12[3];
          local_460._M_dataplus._M_p = (pointer)paVar13;
        }
        else {
          local_460.field_2._M_allocated_capacity = *puVar15;
          local_460._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_460._M_string_length = puVar12[1];
        *puVar12 = puVar15;
        puVar12[1] = 0;
        *(undefined1 *)puVar15 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0.field_2._8_8_ = plVar10[3];
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *psVar14;
          local_4a0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_4a0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_380,(string *)&local_4a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != paVar13) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        if (local_290 != local_280) {
          operator_delete(local_290,local_280[0] + 1);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480,local_470 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400,local_3f0 + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        pcVar20 = local_380;
        if (local_380 == (char *)0x0) {
          std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
        }
        else {
          sVar11 = strlen(local_380);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
        }
        uVar24 = uVar24 + 1;
        pSVar18 = (SourceLocation *)&pSVar18->parent_construct;
        pOVar23 = local_320;
      } while (pSVar18 != local_320[1].super_SourceLocation.parent_construct);
    }
    paVar1 = &local_4a0.field_2;
    local_4a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,local_4e0._M_dataplus._M_p,
               local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
    std::__cxx11::string::append((char *)&local_4a0);
    std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_420,&local_3c0,&local_4e0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
    local_480 = &local_470;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_470 = *puVar15;
      lStack_468 = plVar10[3];
    }
    else {
      local_470 = *puVar15;
      local_480 = (ulong *)*plVar10;
    }
    local_478 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_4c0);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_460.field_2._M_allocated_capacity = *psVar14;
      local_460.field_2._8_8_ = plVar10[3];
      local_460._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_460.field_2._M_allocated_capacity = *psVar14;
      local_460._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_460._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0.field_2._8_8_ = plVar10[3];
      local_4a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_4a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_380,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar13) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480,local_470 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    pcVar20 = local_380;
    if (local_380 == (char *)0x0) {
      std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
    }
    else {
      sVar11 = strlen(local_380);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
    }
    local_318 = &local_308;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,local_3c0._M_dataplus._M_p,
               local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
    std::__cxx11::string::append((char *)&local_318);
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_4c0);
    local_400 = &local_3f0;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_3f0 = *puVar15;
      lStack_3e8 = plVar10[3];
    }
    else {
      local_3f0 = *puVar15;
      local_400 = (ulong *)*plVar10;
    }
    local_3f8 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_400);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_3a0.field_2._M_allocated_capacity = *psVar14;
      local_3a0.field_2._8_8_ = plVar10[3];
    }
    else {
      local_3a0.field_2._M_allocated_capacity = *psVar14;
      local_3a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_4c0);
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_420.field_2._M_allocated_capacity = *psVar14;
      local_420.field_2._8_8_ = plVar10[3];
    }
    else {
      local_420.field_2._M_allocated_capacity = *psVar14;
      local_420._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_420._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_420);
    local_480 = &local_470;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_470 = *puVar15;
      lStack_468 = plVar10[3];
    }
    else {
      local_470 = *puVar15;
      local_480 = (ulong *)*plVar10;
    }
    local_478 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_480,(ulong)local_360._M_dataplus._M_p);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_460.field_2._M_allocated_capacity = *psVar14;
      local_460.field_2._8_8_ = plVar10[3];
      local_460._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_460.field_2._M_allocated_capacity = *psVar14;
      local_460._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_460._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0.field_2._8_8_ = plVar10[3];
      local_4a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar14;
      local_4a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_4a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_380,(string *)&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar13) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480,local_470 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (local_400 != &local_3f0) {
      operator_delete(local_400,local_3f0 + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    pcVar20 = local_380;
    if (local_380 == (char *)0x0) {
      std::ios::clear((int)auStack_4e8 + (int)*(undefined8 *)((long)local_230 + -0x18) + 0x2b8);
    }
    else {
      sVar11 = strlen(local_380);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar20,sVar11);
    }
    if (local_4c0 != &local_4b0) {
      operator_delete(local_4c0,local_4b0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
    }
    if (local_440 != &local_430) {
      operator_delete(local_440,local_430 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,
                      CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                               local_3e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                               local_360.field_2._M_local_buf[0]) + 1);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p == &local_3c0.field_2) goto LAB_00156c9b;
  }
LAB_00156c8b:
  operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
LAB_00156c9b:
  pvVar4 = pOVar23->clauses_in_original_order;
  ppOVar19 = (pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppOVar19) {
    uVar16 = 0;
    do {
      pOVar5 = *ppOVar19;
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_270,local_2b0,local_2a8 + (long)local_2b0);
      (*pOVar5->_vptr_OpenMPClause[1])(pOVar5,local_230,1,uVar16,(string *)local_270);
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      ppOVar19 = ppOVar19 + 1;
    } while (ppOVar19 !=
             (pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"}\n",2);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT71(uStack_36f,local_370) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,
                    CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                             local_2f0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void OpenMPDirective::generateDOT() {
    std::string directive_kind;
    OpenMPDirectiveKind kind = this->getKind();
    switch(kind) {
        case OMPD_cancellation_point :
                directive_kind = "cancellation_point " ;
                break;
        case OMPD_for_simd:
                directive_kind = "for_simd ";
                break;
        case OMPD_do_simd:
                directive_kind = "do_simd ";
                break;
        case OMPD_parallel_for_simd:
                directive_kind = "parallel_for_simd ";
                break;
        case OMPD_declare_simd:
                directive_kind = "declare_simd ";
                break;
        case OMPD_distribute_simd:
                directive_kind = "distribute_simd ";
                break;
        case OMPD_distribute_parallel_for:
                directive_kind = "distribute_parallel_for ";
                break;
        case OMPD_distribute_parallel_do:
                directive_kind = "distribute_parallel_do ";
                break;
        case OMPD_distribute_parallel_for_simd:
                directive_kind = "distribute_parallel_for_simd ";
                break;
        case OMPD_distribute_parallel_do_simd:
                directive_kind = "distribute_parallel_do_simd ";
                break;
        case OMPD_parallel_for:
                directive_kind = "parallel_for ";
                break;
        case OMPD_parallel_do:
                directive_kind = "parallel_do ";
                break;
        case OMPD_parallel_loop:
                directive_kind = "parallel_loop ";
                break;
        case OMPD_parallel_sections:
                directive_kind = "parallel_sections ";
                break;
        case OMPD_parallel_workshare:
                directive_kind += "parallel_workshare ";
                break;
        case OMPD_parallel_master:
                directive_kind += "parallel_master ";
                break;
        case OMPD_master_taskloop:
                directive_kind += "master_taskloop ";
                break;
        case OMPD_master_taskloop_simd:
                directive_kind += "master_taskloop_simd ";
                break;
        case OMPD_parallel_master_taskloop:
                directive_kind += "parallel_master_taskloop ";
                break;
        case OMPD_parallel_master_taskloop_simd:
                directive_kind += "parallel_master_taskloop_simd ";
                break;
        case OMPD_declare_reduction:
                directive_kind = "declare_reduction ";
                break;
        case OMPD_declare_mapper:
                directive_kind = "declare_mapper ";
                break;
        case OMPD_taskloop_simd:
                directive_kind = "taskloop_simd ";
                break;
        case OMPD_target_data:
                directive_kind = "target_data ";
                break;
        case OMPD_target_enter_data:
                directive_kind = "target_enter_data ";
                break;
        case OMPD_target_exit_data:
                directive_kind = "target_exit_data ";
                break;
        case OMPD_target_update:
                directive_kind = "target_update ";
                break;
        case OMPD_declare_target:
                directive_kind = "declare_target ";
                break;
        case OMPD_end_declare_target:
                directive_kind = "end_declare_target ";
                break;
        case OMPD_teams_distribute:
                directive_kind += "teams_distribute ";
                break;
        case OMPD_teams_distribute_simd:
                directive_kind += "teams_distribute_simd ";
                break;
        case OMPD_teams_distribute_parallel_for:
                directive_kind += "teams_distribute_parallel_for ";
                break;
        case OMPD_teams_distribute_parallel_for_simd:
                directive_kind += "teams_distribute_parallel_for_simd ";
                break;
        case OMPD_teams_loop:
                directive_kind += "teams_loop ";
                break;
        case OMPD_target_parallel:
                directive_kind += "target_parallel ";
                break;
        case OMPD_target_parallel_for:
                directive_kind += "target_parallel_for ";
                break;
        case OMPD_target_parallel_for_simd:
                directive_kind += "target_parallel_for_simd ";
                break;
        case OMPD_target_parallel_loop:
                directive_kind += "target_parallel_loop ";
                break;
        case OMPD_target_simd:
                directive_kind += "target_simd ";
                break;
        case OMPD_target_teams:
                directive_kind += "target_teams ";
                break;
        case OMPD_target_teams_distribute:
                directive_kind += "target_teams_distribute ";
                break;
        case OMPD_target_teams_distribute_simd:
                directive_kind += "target_teams_distribute_simd ";
                break;
        case OMPD_target_teams_loop:
                directive_kind += "target_teams_loop ";
                break;
        case OMPD_target_teams_distribute_parallel_for:
                directive_kind += "target_teams_distribute_parallel_for ";
                break;
        case OMPD_target_teams_distribute_parallel_for_simd:
                directive_kind += "target_teams_distribute_parallel_for simd ";
                break;
        case OMPD_teams_distribute_parallel_do:
                directive_kind += "teams distribute parallel do ";
                break;
        case OMPD_teams_distribute_parallel_do_simd:
                directive_kind += "teams distribute parallel do simd ";
                break;
        case OMPD_target_parallel_do:
                directive_kind += "target parallel do ";
                break;
        case OMPD_target_parallel_do_simd:
                directive_kind += "target parallel do simd ";
                break;
        case OMPD_target_teams_distribute_parallel_do:
                directive_kind += "target teams distribute parallel do ";
                break;
        case OMPD_target_teams_distribute_parallel_do_simd:
                directive_kind += "target teams distribute parallel do simd ";
                break;
        default:
                directive_kind = this->toString();
    }
    std::string current_line;

    current_line = "graph OpenMPIR_" + directive_kind + " {\n";

    std::string filename = "OpenMPIR_" + directive_kind.substr(0, directive_kind.size() - 1) + ".dot";
    std::ofstream output(filename.c_str());

    output << current_line.c_str();
    output << "\t" << directive_kind.c_str() << "\n";
    std::string node_id = "";
    switch (kind) {
        case OMPD_allocate: {
            std::string indent = std::string(1, '\t');
            std::vector<const char *> *list = ((OpenMPAllocateDirective *) this)->getAllocateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "allocate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
           break;
        }
        case OMPD_threadprivate: {
            std::string indent = std::string(1, '\t');
            std::vector<const char *> *list = ((OpenMPThreadprivateDirective*)this)->getThreadprivateList();
            std::vector<const char *>::iterator list_item;
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "threadprivate";
            list_name = tkind + "_directive_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
           break;
        }
        case OMPD_declare_reduction: {
            std::string indent = std::string(1, '\t');
            std::vector<const char*>* list = ((OpenMPDeclareReductionDirective*)this)->getTypenameList();
            std::vector<const char*>::iterator list_item;
            std::string id = ((OpenMPDeclareReductionDirective*)this)->getIdentifier();
            std::string combiner = ((OpenMPDeclareReductionDirective*)this)->getCombiner();
            int list_index = 0;
            std::string list_name;
            std::string expr_name;
            std::string tkind = "declare_reduction";
            std::string node_id = tkind + "_reduction_identifier";
            current_line = indent + tkind + " -- " + node_id + "\n";
            output << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + id + "\"]\n";
            output << current_line.c_str();
            list_name = tkind + "_typename_list_" + std::to_string(list_index);
            current_line = indent + tkind + " -- " + list_name + "\n";
            output << current_line.c_str();
            for (list_item = list->begin(); list_item != list->end(); list_item++) {
                expr_name = list_name + "_expr" + std::to_string(list_index);
                list_index += 1;
                current_line = indent + indent + list_name + " -- " + expr_name + "\n";
                output << current_line.c_str();
                current_line =
                    indent + indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*list_item) +
                    "\"]\n";
                output << current_line.c_str();
            }
            node_id = tkind + "_combiner";
            current_line = indent + tkind + " -- " + node_id + "\n";
            output << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + combiner + "\"]\n";
            output << current_line.c_str();
           break;
        }
        case OMPD_declare_simd: {
            std::string indent = std::string(1, '\t');
            std::string proc_name = ((OpenMPDeclareSimdDirective*)this)->getProcName();
            std::string tkind = "declare_simd";
            std::string node_id = tkind + "_proc_name";
            if (proc_name != ""){
              current_line = indent + tkind + " -- " + node_id + "\n";
              output << current_line.c_str();
              current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + proc_name + "\"]\n";
              output << current_line.c_str();
            }
           break;
        }
        default: {
            node_id = directive_kind.substr(0, directive_kind.size() - 1);
        }
    };

    std::vector<OpenMPClause*>* clauses = this->getClausesInOriginalOrder();
    if (clauses->size() != 0) {
        std::vector<OpenMPClause*>::iterator iter;
        int clause_index = 0;
        for (iter = clauses->begin(); iter != clauses->end(); iter++) {
            (*iter)->generateDOT(output, 1, clause_index, node_id);
            clause_index += 1;
        };
    };

    output << "}\n";

}